

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2AttributeDecl(void)

{
  int iVar1;
  int iVar2;
  int val;
  void *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlChar *val_03;
  int local_6c;
  int n_tree;
  xmlEnumerationPtr tree;
  int n_defaultValue;
  xmlChar *defaultValue;
  int n_def;
  int def;
  int n_type;
  int type;
  int n_fullname;
  xmlChar *fullname;
  int n_elem;
  xmlChar *elem;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (elem._4_4_ = 0; (int)elem._4_4_ < 2; elem._4_4_ = elem._4_4_ + 1) {
    for (fullname._4_4_ = 0; (int)fullname._4_4_ < 5; fullname._4_4_ = fullname._4_4_ + 1) {
      for (n_type = 0; n_type < 5; n_type = n_type + 1) {
        for (n_def = 0; n_def < 4; n_def = n_def + 1) {
          for (defaultValue._4_4_ = 0; (int)defaultValue._4_4_ < 4;
              defaultValue._4_4_ = defaultValue._4_4_ + 1) {
            for (tree._4_4_ = 0; (int)tree._4_4_ < 5; tree._4_4_ = tree._4_4_ + 1) {
              for (local_6c = 0; local_6c < 1; local_6c = local_6c + 1) {
                iVar1 = xmlMemBlocks();
                val_00 = gen_void_ptr(elem._4_4_,0);
                val_01 = gen_const_xmlChar_ptr(fullname._4_4_,1);
                val_02 = gen_const_xmlChar_ptr(n_type,2);
                iVar2 = gen_int(n_def,3);
                val = gen_int(defaultValue._4_4_,4);
                val_03 = gen_const_xmlChar_ptr(tree._4_4_,5);
                xmlSAX2AttributeDecl(val_00,val_01,val_02,iVar2,val,val_03,0);
                call_tests = call_tests + 1;
                des_void_ptr(elem._4_4_,val_00,0);
                des_const_xmlChar_ptr(fullname._4_4_,val_01,1);
                des_const_xmlChar_ptr(n_type,val_02,2);
                des_int(n_def,iVar2,3);
                des_int(defaultValue._4_4_,val,4);
                des_const_xmlChar_ptr(tree._4_4_,val_03,5);
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlSAX2AttributeDecl",
                         (ulong)(uint)(iVar2 - iVar1));
                  ctx._4_4_ = ctx._4_4_ + 1;
                  printf(" %d",(ulong)elem._4_4_);
                  printf(" %d",(ulong)fullname._4_4_);
                  printf(" %d",(ulong)(uint)n_type);
                  printf(" %d",(ulong)(uint)n_def);
                  printf(" %d",(ulong)defaultValue._4_4_);
                  printf(" %d",(ulong)tree._4_4_);
                  printf(" %d");
                  printf("\n");
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2AttributeDecl(void) {
    int test_ret = 0;

    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    const xmlChar * elem; /* the name of the element */
    int n_elem;
    const xmlChar * fullname; /* the attribute name */
    int n_fullname;
    int type; /* the attribute type */
    int n_type;
    int def; /* the type of default value */
    int n_def;
    const xmlChar * defaultValue; /* the attribute default value */
    int n_defaultValue;
    xmlEnumerationPtr tree; /* the tree of enumerated value set */
    int n_tree;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_elem = 0;n_elem < gen_nb_const_xmlChar_ptr;n_elem++) {
    for (n_fullname = 0;n_fullname < gen_nb_const_xmlChar_ptr;n_fullname++) {
    for (n_type = 0;n_type < gen_nb_int;n_type++) {
    for (n_def = 0;n_def < gen_nb_int;n_def++) {
    for (n_defaultValue = 0;n_defaultValue < gen_nb_const_xmlChar_ptr;n_defaultValue++) {
    for (n_tree = 0;n_tree < gen_nb_xmlEnumerationPtr;n_tree++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        elem = gen_const_xmlChar_ptr(n_elem, 1);
        fullname = gen_const_xmlChar_ptr(n_fullname, 2);
        type = gen_int(n_type, 3);
        def = gen_int(n_def, 4);
        defaultValue = gen_const_xmlChar_ptr(n_defaultValue, 5);
        tree = gen_xmlEnumerationPtr(n_tree, 6);

        xmlSAX2AttributeDecl(ctx, elem, fullname, type, def, defaultValue, tree);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_elem, elem, 1);
        des_const_xmlChar_ptr(n_fullname, fullname, 2);
        des_int(n_type, type, 3);
        des_int(n_def, def, 4);
        des_const_xmlChar_ptr(n_defaultValue, defaultValue, 5);
        des_xmlEnumerationPtr(n_tree, tree, 6);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2AttributeDecl",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_elem);
            printf(" %d", n_fullname);
            printf(" %d", n_type);
            printf(" %d", n_def);
            printf(" %d", n_defaultValue);
            printf(" %d", n_tree);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}